

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mpi_get_digit(mbedtls_mpi_uint *d,int radix,char c)

{
  int iVar1;
  ulong uVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  
  iVar1 = (int)CONCAT71(in_register_00000011,c);
  uVar2 = 0xff;
  if ((byte)(c - 0x30U) < 10) {
    uVar2 = (ulong)(iVar1 - 0x30);
  }
  uVar3 = (ulong)(iVar1 - 0x37);
  if (5 < (byte)(c + 0xbfU)) {
    uVar3 = uVar2;
  }
  uVar2 = (ulong)(iVar1 - 0x57);
  if (5 < (byte)(c + 0x9fU)) {
    uVar2 = uVar3;
  }
  *d = uVar2;
  iVar1 = -6;
  if (uVar2 < (ulong)(long)radix) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int mpi_get_digit( mbedtls_mpi_uint *d, int radix, char c )
{
    *d = 255;

    if( c >= 0x30 && c <= 0x39 ) *d = c - 0x30;
    if( c >= 0x41 && c <= 0x46 ) *d = c - 0x37;
    if( c >= 0x61 && c <= 0x66 ) *d = c - 0x57;

    if( *d >= (mbedtls_mpi_uint) radix )
        return( MBEDTLS_ERR_MPI_INVALID_CHARACTER );

    return( 0 );
}